

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O3

void __thiscall cmCTestSubmitCommand::BindArguments(cmCTestSubmitCommand *this)

{
  cmArgumentParser<void> *this_00;
  string_view name;
  string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  string_view name_08;
  
  this_00 = &(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>;
  if (this->CDashUpload == true) {
    name._M_str = "CDASH_UPLOAD";
    name._M_len = 0xc;
    cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name,&this->CDashUploadFile);
    name_00._M_str = "CDASH_UPLOAD_TYPE";
    name_00._M_len = 0x11;
    cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_00,&this->CDashUploadType);
  }
  else {
    name_01.super_string_view._M_str = "PARTS";
    name_01.super_string_view._M_len = 5;
    cmArgumentParser<void>::
    Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (this_00,name_01,&this->Parts);
    name_02.super_string_view._M_str = "FILES";
    name_02.super_string_view._M_len = 5;
    cmArgumentParser<void>::
    Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (this_00,name_02,&this->Files);
  }
  name_03.super_string_view._M_str = "BUILD_ID";
  name_03.super_string_view._M_len = 8;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_03,&this->BuildID);
  name_04.super_string_view._M_str = "HTTPHEADER";
  name_04.super_string_view._M_len = 10;
  cmArgumentParser<void>::
  Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (this_00,name_04,&this->HttpHeaders);
  name_05.super_string_view._M_str = "RETRY_COUNT";
  name_05.super_string_view._M_len = 0xb;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_05,&this->RetryCount);
  name_06.super_string_view._M_str = "RETRY_DELAY";
  name_06.super_string_view._M_len = 0xb;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_06,&this->RetryDelay);
  name_07.super_string_view._M_str = "SUBMIT_URL";
  name_07.super_string_view._M_len = 10;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_07,&this->SubmitURL);
  name_08._M_str = "INTERNAL_TEST_CHECKSUM";
  name_08._M_len = 0x16;
  cmArgumentParser<void>::Bind<bool>(this_00,name_08,&this->InternalTest);
  cmCTestHandlerCommand::BindArguments(&this->super_cmCTestHandlerCommand);
  return;
}

Assistant:

void cmCTestSubmitCommand::BindArguments()
{
  if (this->CDashUpload) {
    // Arguments specific to the CDASH_UPLOAD signature.
    this->Bind("CDASH_UPLOAD", this->CDashUploadFile);
    this->Bind("CDASH_UPLOAD_TYPE", this->CDashUploadType);
  } else {
    // Arguments that cannot be used with CDASH_UPLOAD.
    this->Bind("PARTS"_s, this->Parts);
    this->Bind("FILES"_s, this->Files);
  }
  // Arguments used by both modes.
  this->Bind("BUILD_ID"_s, this->BuildID);
  this->Bind("HTTPHEADER"_s, this->HttpHeaders);
  this->Bind("RETRY_COUNT"_s, this->RetryCount);
  this->Bind("RETRY_DELAY"_s, this->RetryDelay);
  this->Bind("SUBMIT_URL"_s, this->SubmitURL);
  this->Bind("INTERNAL_TEST_CHECKSUM", this->InternalTest);

  // Look for other arguments.
  this->cmCTestHandlerCommand::BindArguments();
}